

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArHosekSkyModel.c
# Opt level: O3

double arhosekskymodel_solar_radiance_internal2
                 (ArHosekSkyModelState *state,double wavelength,double elevation,double gamma)

{
  double *pdVar1;
  double *pdVar2;
  int turbidity;
  int wl;
  long lVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double ldCoefficient [6];
  double local_58 [7];
  
  dVar5 = sin(state->solar_radius);
  dVar6 = sin(gamma);
  dVar5 = (-1.0 / (dVar5 * dVar5)) * dVar6 * dVar6 + 1.0;
  dVar7 = 0.0;
  dVar6 = 0.0;
  if (0.0 <= dVar5) {
    dVar6 = dVar5;
  }
  dVar6 = SQRT(dVar6);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar5 = state->turbidity;
    dVar7 = 1.0;
    turbidity = 8;
    if ((int)dVar5 + -1 != 9) {
      dVar7 = dVar5 - (double)(int)dVar5;
      turbidity = (int)dVar5 + -1;
    }
    iVar4 = (int)((wavelength + -320.0) / 40.0);
    dVar8 = fmod(wavelength,40.0);
    dVar5 = 1.0;
    wl = 9;
    if (iVar4 != 10) {
      dVar5 = dVar8 / 40.0;
      wl = iVar4;
    }
    dVar8 = 1.0 - dVar5;
    dVar9 = arhosekskymodel_sr_internal(state,turbidity,wl,elevation);
    dVar10 = arhosekskymodel_sr_internal(state,turbidity,wl + 1,elevation);
    dVar11 = arhosekskymodel_sr_internal(state,turbidity + 1,wl,elevation);
    dVar12 = arhosekskymodel_sr_internal(state,turbidity + 1,wl + 1,elevation);
    pdVar1 = limbDarkeningDatasets[wl];
    pdVar2 = limbDarkeningDatasets[(long)wl + 1];
    lVar3 = 0;
    do {
      dVar13 = (pdVar1 + lVar3)[1];
      dVar14 = (pdVar2 + lVar3)[1];
      local_58[lVar3] = pdVar2[lVar3] * dVar5 + pdVar1[lVar3] * dVar8;
      local_58[lVar3 + 1] = dVar14 * dVar5 + dVar13 * dVar8;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 6);
    dVar13 = pow(dVar6,3.0);
    dVar14 = pow(dVar6,4.0);
    dVar15 = pow(dVar6,5.0);
    dVar7 = (dVar15 * local_58[5] +
            dVar14 * local_58[4] +
            dVar13 * local_58[3] + dVar6 * dVar6 * local_58[2] + local_58[1] * dVar6 + local_58[0])
            * ((dVar8 * dVar9 + dVar10 * dVar5) * (1.0 - dVar7) +
              (dVar11 * dVar8 + dVar12 * dVar5) * dVar7);
  }
  return dVar7;
}

Assistant:

double arhosekskymodel_solar_radiance_internal2(
        ArHosekSkyModelState  * state,
        double                  wavelength,
        double                  elevation,
        double                  gamma
        )
{
    assert(
           wavelength >= 320.0
        && wavelength <= 720.0
        && state->turbidity >= 1.0
        && state->turbidity <= 10.0
        );
            
    
    // sun distance to diameter ratio, squared

    const double sol_rad_sin = sin(state->solar_radius);
    const double ar2 = 1 / ( sol_rad_sin * sol_rad_sin );
    const double singamma = sin(gamma);
    double sc2 = 1.0 - ar2 * singamma * singamma;
    if (sc2 < 0.0 ) sc2 = 0.0;
    double sampleCosine = sqrt (sc2);
    if (sampleCosine == 0.) return 0.;

    int     turb_low  = (int) state->turbidity - 1;
    double  turb_frac = state->turbidity - (double) (turb_low + 1);
    
    if ( turb_low == 9 )
    {
        turb_low  = 8;
        turb_frac = 1.0;
    }

    int    wl_low  = (int) ((wavelength - 320.0) / 40.0);
    double wl_frac = fmod(wavelength, 40.0) / 40.0;
    
    if ( wl_low == 10 )
    {
        wl_low = 9;
        wl_frac = 1.0;
    }

    double direct_radiance =
          ( 1.0 - turb_frac )
        * (    (1.0 - wl_frac)
             * arhosekskymodel_sr_internal(
                     state,
                     turb_low,
                     wl_low,
                     elevation
                   )
           +   wl_frac
             * arhosekskymodel_sr_internal(
                     state,
                     turb_low,
                     wl_low+1,
                     elevation
                   )
          )
      +   turb_frac
        * (    ( 1.0 - wl_frac )
             * arhosekskymodel_sr_internal(
                     state,
                     turb_low+1,
                     wl_low,
                     elevation
                   )
           +   wl_frac
             * arhosekskymodel_sr_internal(
                     state,
                     turb_low+1,
                     wl_low+1,
                     elevation
                   )
          );

    double ldCoefficient[6];
    
    int i;
    for ( i = 0; i < 6; i++ )
        ldCoefficient[i] =
              (1.0 - wl_frac) * limbDarkeningDatasets[wl_low  ][i]
            +        wl_frac  * limbDarkeningDatasets[wl_low+1][i];
    
    
    //   The following will be improved in future versions of the model:
    //   here, we directly use fitted 5th order polynomials provided by the
    //   astronomical community for the limb darkening effect. Astronomers need
    //   such accurate fittings for their predictions. However, this sort of
    //   accuracy is not really needed for CG purposes, so an approximated
    //   dataset based on quadratic polynomials will be provided in a future
    //   release.

    double  darkeningFactor =
          ldCoefficient[0]
        + ldCoefficient[1] * sampleCosine
        + ldCoefficient[2] * pow( sampleCosine, 2.0 )
        + ldCoefficient[3] * pow( sampleCosine, 3.0 )
        + ldCoefficient[4] * pow( sampleCosine, 4.0 )
        + ldCoefficient[5] * pow( sampleCosine, 5.0 );

    direct_radiance *= darkeningFactor;

    return direct_radiance;
}